

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_loop_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,int plane_start,
               int plane_end,int partial_frame,AVxWorker *workers,int num_workers,AV1LfSync *lf_sync
               ,int lpf_opt_level)

{
  macroblockd_plane *planes;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  LFWorkerData *pLVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  MACROBLOCKD *pMVar10;
  byte bVar11;
  AVxWorker *pAVar12;
  AV1LfMTInfo *pAVar13;
  AVxWorkerInterface *pAVar14;
  long lVar15;
  uint mi_row_00;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  AVxWorker *pAVar23;
  AVxWorker *worker;
  int iVar24;
  int mi_row;
  long lVar25;
  bool bVar26;
  aom_internal_error_info *in_stack_fffffffffffffd40;
  uint local_294 [3];
  AVxWorkerInterface *local_288;
  MACROBLOCKD *local_280;
  uint local_274;
  YV12_BUFFER_CONFIG *local_270;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  TX_SIZE local_258 [32];
  aom_internal_error_info error_info;
  
  if ((cm->lf).filter_level[0] == 0) {
    uVar21 = 0;
    if ((0 < plane_start) || ((cm->lf).filter_level[1] == 0)) goto LAB_00339575;
  }
  else {
    uVar21 = 0;
    if (0 < plane_start) goto LAB_00339575;
  }
  uVar21 = (uint)(0 < plane_end);
LAB_00339575:
  uVar3 = (cm->lf).filter_level_u;
  uVar4 = (cm->lf).filter_level_v;
  local_268 = ~-(uint)(uVar3 == 0 || 1 < plane_start) & -(uint)(1 < plane_end);
  uStack_260 = ~-(uint)(uVar4 == 0 || 2 < plane_start) & -(uint)(2 < plane_end);
  local_294[1] = local_268 & 1;
  local_294[2] = uStack_260 & 1;
  if ((byte)((plane_end < 1 || 0 < plane_start) | (byte)uVar21) == 1) {
    bVar11 = (byte)uStack_260;
    local_288._0_1_ = (byte)local_268;
    if ((((byte)uVar21 | (byte)local_268 | (byte)uStack_260) & 1) != 0) {
      uVar5 = (cm->mi_params).mi_rows;
      if ((int)uVar5 < 9 || partial_frame == 0) {
        mi_row_00 = 0;
        uVar19 = uVar5;
      }
      else {
        mi_row_00 = uVar5 >> 1 & 0x3ffffff8;
        uVar19 = 8;
        if (0x47 < uVar5) {
          uVar19 = uVar5 >> 3;
        }
      }
      iVar20 = uVar19 + mi_row_00;
      local_294[0] = uVar21;
      local_280 = xd;
      local_270 = frame;
      uStack_264 = local_268;
      uStack_25c = uStack_260;
      av1_loop_filter_frame_init(cm,plane_start,plane_end);
      if (1 < num_workers) {
        local_288 = aom_get_worker_interface();
        iVar24 = (cm->mi_params).mi_rows + 0x1f >> 5;
        if (((lf_sync->sync_range == 0) || (iVar24 != lf_sync->rows)) ||
           (lf_sync->num_workers < num_workers)) {
          av1_loop_filter_dealloc(lf_sync);
          av1_loop_filter_alloc(lf_sync,cm,iVar24,cm->width,num_workers);
        }
        lf_sync->lf_mt_exit = false;
        for (lVar25 = 6; pMVar10 = local_280, lVar25 != 9; lVar25 = lVar25 + 1) {
          memset(lf_sync->mutex_[lVar25],0xff,(long)iVar24 << 2);
        }
        pAVar13 = lf_sync->job_queue;
        lf_sync->jobs_enqueued = 0;
        lf_sync->jobs_dequeued = 0;
        iVar24 = 0;
        iVar16 = 0;
        do {
          uVar21 = mi_row_00;
          if (iVar16 == 2) {
            uVar17 = (ulong)(uint)num_workers;
            lVar25 = uVar17 * 0x2268 + -0x2248;
            uVar18 = uVar17;
            while (0 < (int)uVar18) {
              uVar18 = uVar18 - 1;
              pLVar6 = lf_sync->lfdata;
              workers[uVar18].hook = loop_filter_row_worker;
              workers[uVar18].data1 = lf_sync;
              workers[uVar18].data2 = pLVar6 + uVar18;
              pLVar6[uVar18].frame_buffer = local_270;
              pLVar6[uVar18].cm = cm;
              pLVar6[uVar18].xd = local_280;
              for (lVar15 = 0; lVar15 != 0x1e90; lVar15 = lVar15 + 0xa30) {
                puVar1 = (undefined8 *)((long)&pMVar10->plane[0].pre[-1].buf + lVar15);
                uVar7 = *puVar1;
                uVar8 = puVar1[1];
                puVar1 = (undefined8 *)((long)pMVar10->plane[0].pre + lVar15 + -0x10);
                uVar9 = puVar1[1];
                puVar2 = (undefined8 *)((long)pLVar6->planes[0].pre + lVar15 + lVar25 + -0x30);
                *puVar2 = *puVar1;
                puVar2[1] = uVar9;
                puVar1 = (undefined8 *)((long)(pLVar6->planes[0].pre + -2) + lVar15 + lVar25);
                *puVar1 = uVar7;
                puVar1[1] = uVar8;
                *(undefined8 *)((long)pLVar6->planes[0].pre + lVar15 + lVar25 + -0x4c) =
                     *(undefined8 *)((long)pMVar10->plane[0].pre + lVar15 + -0x2c);
              }
              workers[uVar18].had_error = 0;
              (*(&local_288->launch)[uVar18 == 0])(workers + uVar18);
              lVar25 = lVar25 + -0x2268;
            }
            pAVar14 = aom_get_worker_interface();
            iVar20 = workers->had_error;
            if (iVar20 != 0) {
              memcpy(&error_info,(void *)((long)workers->data2 + 0x20c8),0x1a0);
            }
            bVar26 = iVar20 == 0;
            do {
              iVar20 = (int)uVar17 + 1;
              pAVar12 = workers + (uVar17 - 1);
              do {
                pAVar23 = pAVar12;
                iVar20 = iVar20 + -1;
                if (iVar20 < 2) {
                  if (bVar26) {
                    return;
                  }
                  aom_internal_error_copy(cm->error,&error_info);
                  return;
                }
                uVar17 = uVar17 - 1;
                iVar24 = (*pAVar14->sync)(pAVar23);
                pAVar12 = pAVar23 + -1;
              } while (iVar24 != 0);
              memcpy(&error_info,(void *)((long)pAVar23->data2 + 0x20c8),0x1a0);
              bVar26 = false;
            } while( true );
          }
          for (; (int)uVar21 < iVar20; uVar21 = uVar21 + 0x20) {
            for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
              iVar22 = (int)lVar25;
              if (lpf_opt_level == 2) {
                if (iVar22 != 2) {
                  uVar5 = local_294[0];
                  if (iVar22 != 1) goto joined_r0x0033981e;
                  if (local_294[2] == 0 && local_294[1] == 0) goto LAB_00339846;
                  goto LAB_00339829;
                }
              }
              else {
                uVar5 = local_294[lVar25];
joined_r0x0033981e:
                if (uVar5 != 0) {
LAB_00339829:
                  if (local_294[lVar25] != 0) {
                    pAVar13->mi_row = uVar21;
                    pAVar13->plane = iVar22;
                    pAVar13->dir = iVar16;
                    pAVar13->lpf_opt_level = lpf_opt_level;
                    pAVar13 = pAVar13 + 1;
                    iVar24 = iVar24 + 1;
                    lf_sync->jobs_enqueued = iVar24;
                  }
                }
              }
LAB_00339846:
            }
          }
          iVar16 = iVar16 + 1;
        } while( true );
      }
      local_274 = uVar21;
      planes = local_280->plane;
      local_288 = (AVxWorkerInterface *)CONCAT71(local_288._1_7_,(byte)local_288 | bVar11);
      for (; (int)mi_row_00 < iVar20; mi_row_00 = mi_row_00 + 0x20) {
        for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
          iVar24 = (int)lVar25;
          if (lpf_opt_level == 2) {
            if (iVar24 != 2) {
              if (iVar24 != 1) {
                iVar24 = 0;
                uVar21 = local_274;
                goto joined_r0x0033974f;
              }
              iVar24 = 1;
              if (((ulong)local_288 & 1) == 0) goto LAB_003397ba;
              goto LAB_00339765;
            }
          }
          else {
            uVar21 = local_294[lVar25];
joined_r0x0033974f:
            if (uVar21 != 0) {
LAB_00339765:
              for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
                av1_thread_loop_filter_rows
                          (local_270,cm,planes,local_280,mi_row_00,iVar24,iVar16,lpf_opt_level,
                           (AV1LfSync *)0x0,in_stack_fffffffffffffd40,
                           (AV1_DEBLOCKING_PARAMETERS *)&error_info,local_258,5);
              }
            }
          }
LAB_003397ba:
        }
      }
    }
  }
  return;
}

Assistant:

void av1_loop_filter_frame_mt(YV12_BUFFER_CONFIG *frame, AV1_COMMON *cm,
                              MACROBLOCKD *xd, int plane_start, int plane_end,
                              int partial_frame, AVxWorker *workers,
                              int num_workers, AV1LfSync *lf_sync,
                              int lpf_opt_level) {
  int start_mi_row, end_mi_row, mi_rows_to_filter;
  int planes_to_lf[MAX_MB_PLANE];

  if (!check_planes_to_loop_filter(&cm->lf, planes_to_lf, plane_start,
                                   plane_end))
    return;

  start_mi_row = 0;
  mi_rows_to_filter = cm->mi_params.mi_rows;
  if (partial_frame && cm->mi_params.mi_rows > 8) {
    start_mi_row = cm->mi_params.mi_rows >> 1;
    start_mi_row &= 0xfffffff8;
    mi_rows_to_filter = AOMMAX(cm->mi_params.mi_rows / 8, 8);
  }
  end_mi_row = start_mi_row + mi_rows_to_filter;
  av1_loop_filter_frame_init(cm, plane_start, plane_end);

  if (num_workers > 1) {
    // Enqueue and execute loopfiltering jobs.
    loop_filter_rows_mt(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                        workers, num_workers, lf_sync, lpf_opt_level);
  } else {
    // Directly filter in the main thread.
    loop_filter_rows(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                     lpf_opt_level);
  }
}